

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O1

void __thiscall
test::
iu_peep_set_m_x319<test::prod_test::ProdClass,_test::iu_peep_tag_m_x<test::prod_test::ProdClass>,_&test::prod_test::ProdClass::m_x>
::iu_peep_set_m_x319
          (iu_peep_set_m_x319<test::prod_test::ProdClass,_test::iu_peep_tag_m_x<test::prod_test::ProdClass>,_&test::prod_test::ProdClass::m_x>
           *this)

{
  iutest::detail::peep_tag<test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::value = 4;
  return;
}

Assistant:

IUTEST(PeepTest, ScopedPeep)
{
    // マクロ版
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetZ());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z));
    }
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetX());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x));
    }
}